

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTAudioEngine_Pause(FACTAudioEngine *pEngine,uint16_t nCategory,int32_t fPause)

{
  uint8_t uVar1;
  uint16_t in_SI;
  FACTAudioEngine *in_RDI;
  LinkedList *list;
  FACTCue *cue;
  FACTCue *in_stack_ffffffffffffffd8;
  LinkedList *local_20;
  long local_18;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x113916);
  for (local_20 = in_RDI->sbList; local_20 != (LinkedList *)0x0; local_20 = local_20->next) {
    for (local_18 = *(long *)((long)local_20->entry + 8); local_18 != 0;
        local_18 = *(long *)(local_18 + 8)) {
      if (*(long *)(local_18 + 0x48) != 0) {
        uVar1 = FACT_INTERNAL_IsInCategory
                          (in_RDI,in_SI,*(uint16_t *)(**(long **)(local_18 + 0x48) + 2));
        if (uVar1 != '\0') {
          FACTCue_Pause(in_stack_ffffffffffffffd8,0);
        }
      }
    }
  }
  FAudio_PlatformUnlockMutex((FAudioMutex)0x1139c1);
  return 0;
}

Assistant:

uint32_t FACTAudioEngine_Pause(
	FACTAudioEngine *pEngine,
	uint16_t nCategory,
	int32_t fPause
) {
	FACTCue *cue;
	LinkedList *list;

	FAudio_PlatformLockMutex(pEngine->apiLock);
	list = pEngine->sbList;
	while (list != NULL)
	{
		cue = ((FACTSoundBank*) list->entry)->cueList;
		while (cue != NULL)
		{
			if (	cue->playingSound != NULL &&
				FACT_INTERNAL_IsInCategory(
					pEngine,
					nCategory,
					cue->playingSound->sound->category
				)	)
			{
				FACTCue_Pause(cue, fPause);
			}
			cue = cue->next;
		}
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return 0;
}